

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::MergeReturnPass::PredicateBlocks
          (MergeReturnPass *this,BasicBlock *return_block,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *predicated,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order)

{
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  size_type sVar3;
  pointer pSVar4;
  IRContext *this_01;
  bool bVar5;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar6;
  reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
  local_f8;
  uint32_t local_ec;
  Instruction *pIStack_e8;
  uint32_t merge_block_id;
  Instruction *break_merge_inst;
  byte local_d8;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> local_d0;
  byte local_c8;
  reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
  local_c0;
  reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
  local_b8;
  undefined1 local_b0 [8];
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  seen;
  reverse_iterator state;
  function<void_(unsigned_int)> local_60;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *local_40;
  BasicBlock *const_block;
  BasicBlock *block;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *predicated_local;
  BasicBlock *return_block_local;
  MergeReturnPass *this_local;
  
  block = (BasicBlock *)order;
  order_local = (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
                predicated;
  predicated_local =
       (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
        *)return_block;
  return_block_local = (BasicBlock *)this;
  sVar3 = std::
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          ::count(predicated,(key_type *)&predicated_local);
  this_00 = predicated_local;
  if (sVar3 == 0) {
    const_block = (BasicBlock *)0x0;
    local_40 = predicated_local;
    state.current._M_current =
         (__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>
          )(__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>
            )this;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::MergeReturnPass::PredicateBlocks(spvtools::opt::BasicBlock*,std::unordered_set<spvtools::opt::BasicBlock*,std::hash<spvtools::opt::BasicBlock*>,std::equal_to<spvtools::opt::BasicBlock*>,std::allocator<spvtools::opt::BasicBlock*>>*,std::__cxx11::list<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>*)::__0,void>
              ((function<void(unsigned_int)> *)&local_60,(anon_class_16_2_f791057a *)&state);
    BasicBlock::ForEachSuccessorLabel((BasicBlock *)this_00,&local_60);
    std::function<void_(unsigned_int)>::~function(&local_60);
    if (const_block == (BasicBlock *)0x0) {
      __assert_fail("block && \"Return blocks should have returns already replaced by a single \" \"unconditional branch.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x194,
                    "bool spvtools::opt::MergeReturnPass::PredicateBlocks(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *)"
                   );
    }
    std::
    vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
    ::rbegin((vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
              *)&seen._M_h._M_single_bucket);
    std::
    unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
    ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)local_b0);
    uVar1 = BasicBlock::id(const_block);
    pSVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                           *)&seen._M_h._M_single_bucket);
    uVar2 = StructuredControlState::CurrentMergeId(pSVar4);
    if (uVar1 == uVar2) {
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
      ::operator++(&local_b8,(int)&seen + 0x30);
    }
    else {
      uVar1 = BasicBlock::id(const_block);
      pSVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                             *)&seen._M_h._M_single_bucket);
      uVar2 = StructuredControlState::BreakMergeId(pSVar4);
      if (uVar1 == uVar2) {
        while( true ) {
          pSVar4 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                                 *)&seen._M_h._M_single_bucket);
          uVar1 = StructuredControlState::BreakMergeId(pSVar4);
          uVar2 = BasicBlock::id(const_block);
          if (uVar1 != uVar2) break;
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
          ::operator++(&local_c0,(int)&seen + 0x30);
        }
      }
    }
    do {
      bVar5 = false;
      if (const_block != (BasicBlock *)0x0) {
        bVar5 = const_block != this->final_return_block_;
      }
      if (!bVar5) {
LAB_004271bb:
        this_local._7_1_ = 1;
        goto LAB_004271c9;
      }
      pVar6 = std::
              unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)order_local,&const_block);
      break_merge_inst =
           (Instruction *)
           pVar6.first.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur;
      local_d8 = pVar6.second;
      local_d0._M_cur = (__node_type *)break_merge_inst;
      local_c8 = local_d8;
      if (((local_d8 ^ 0xff) & 1) != 0) goto LAB_004271bb;
      pSVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                             *)&seen._M_h._M_single_bucket);
      bVar5 = StructuredControlState::InBreakable(pSVar4);
      if (!bVar5) {
        __assert_fail("state->InBreakable() && \"Should be in the placeholder construct at the very least.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                      ,0x1a4,
                      "bool spvtools::opt::MergeReturnPass::PredicateBlocks(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *)"
                     );
      }
      pSVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                             *)&seen._M_h._M_single_bucket);
      pIStack_e8 = StructuredControlState::BreakMergeInst(pSVar4);
      local_ec = Instruction::GetSingleWordInOperand(pIStack_e8,0);
      while( true ) {
        pSVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
                               *)&seen._M_h._M_single_bucket);
        uVar1 = StructuredControlState::BreakMergeId(pSVar4);
        if (uVar1 != local_ec) break;
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::MergeReturnPass::StructuredControlState_*,_std::vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>_>_>
        ::operator++(&local_f8,(int)&seen + 0x30);
      }
      bVar5 = BreakFromConstruct(this,const_block,
                                 (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                  *)order_local,
                                 (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                  *)block,pIStack_e8);
      if (!bVar5) goto code_r0x00427188;
      this_01 = Pass::context((Pass *)this);
      const_block = IRContext::get_instr_block(this_01,local_ec);
    } while( true );
  }
  this_local._7_1_ = 1;
LAB_004271d5:
  return (bool)(this_local._7_1_ & 1);
code_r0x00427188:
  this_local._7_1_ = 0;
LAB_004271c9:
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)local_b0);
  goto LAB_004271d5;
}

Assistant:

bool MergeReturnPass::PredicateBlocks(
    BasicBlock* return_block, std::unordered_set<BasicBlock*>* predicated,
    std::list<BasicBlock*>* order) {
  // The CFG is being modified as the function proceeds so avoid caching
  // successors.

  if (predicated->count(return_block)) {
    return true;
  }

  BasicBlock* block = nullptr;
  const BasicBlock* const_block = const_cast<const BasicBlock*>(return_block);
  const_block->ForEachSuccessorLabel([this, &block](const uint32_t idx) {
    BasicBlock* succ_block = context()->get_instr_block(idx);
    assert(block == nullptr);
    block = succ_block;
  });
  assert(block &&
         "Return blocks should have returns already replaced by a single "
         "unconditional branch.");

  auto state = state_.rbegin();
  std::unordered_set<BasicBlock*> seen;
  if (block->id() == state->CurrentMergeId()) {
    state++;
  } else if (block->id() == state->BreakMergeId()) {
    while (state->BreakMergeId() == block->id()) {
      state++;
    }
  }

  while (block != nullptr && block != final_return_block_) {
    if (!predicated->insert(block).second) break;
    // Skip structured subgraphs.
    assert(state->InBreakable() &&
           "Should be in the placeholder construct at the very least.");
    Instruction* break_merge_inst = state->BreakMergeInst();
    uint32_t merge_block_id = break_merge_inst->GetSingleWordInOperand(0);
    while (state->BreakMergeId() == merge_block_id) {
      state++;
    }
    if (!BreakFromConstruct(block, predicated, order, break_merge_inst)) {
      return false;
    }
    block = context()->get_instr_block(merge_block_id);
  }
  return true;
}